

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode NodeId_decodeBinary(UA_NodeId *dst,UA_DataType *_)

{
  UA_StatusCode UVar1;
  UA_StatusCode local_28;
  UA_UInt16 local_24;
  UA_Byte local_22;
  byte local_21;
  UA_StatusCode retval;
  UA_UInt16 dstUInt16;
  UA_Byte encodingByte;
  UA_Byte dstByte;
  UA_DataType *__local;
  UA_NodeId *dst_local;
  
  local_21 = 0;
  local_22 = '\0';
  local_24 = 0;
  _retval = _;
  __local = (UA_DataType *)dst;
  dst_local._4_4_ = Byte_decodeBinary(&local_22,(UA_DataType *)0x0);
  if (dst_local._4_4_ == 0) {
    switch(local_22) {
    case '\0':
      *(undefined4 *)((long)&__local->typeName + 4) = 0;
      local_28 = Byte_decodeBinary(&local_21,(UA_DataType *)0x0);
      *(uint *)&__local->typeId = (uint)local_21;
      *(undefined2 *)&__local->typeName = 0;
      break;
    case '\x01':
      *(undefined4 *)((long)&__local->typeName + 4) = 0;
      UVar1 = Byte_decodeBinary(&local_21,(UA_DataType *)0x0);
      *(ushort *)&__local->typeName = (ushort)local_21;
      local_28 = UInt16_decodeBinary(&local_24,(UA_DataType *)0x0);
      local_28 = local_28 | UVar1;
      *(uint *)&__local->typeId = (uint)local_24;
      break;
    case '\x02':
      *(undefined4 *)((long)&__local->typeName + 4) = 0;
      UVar1 = UInt16_decodeBinary((UA_UInt16 *)__local,(UA_DataType *)0x0);
      local_28 = UInt32_decodeBinary((UA_UInt32 *)&__local->typeId,(UA_DataType *)0x0);
      local_28 = local_28 | UVar1;
      break;
    case '\x03':
      *(undefined4 *)((long)&__local->typeName + 4) = 3;
      UVar1 = UInt16_decodeBinary((UA_UInt16 *)__local,(UA_DataType *)0x0);
      local_28 = String_decodeBinary((UA_String *)&__local->typeId,(UA_DataType *)0x0);
      local_28 = local_28 | UVar1;
      break;
    case '\x04':
      *(undefined4 *)((long)&__local->typeName + 4) = 4;
      UVar1 = UInt16_decodeBinary((UA_UInt16 *)__local,(UA_DataType *)0x0);
      local_28 = Guid_decodeBinary((UA_Guid *)&__local->typeId,(UA_DataType *)0x0);
      local_28 = local_28 | UVar1;
      break;
    case '\x05':
      *(undefined4 *)((long)&__local->typeName + 4) = 5;
      UVar1 = UInt16_decodeBinary((UA_UInt16 *)__local,(UA_DataType *)0x0);
      local_28 = ByteString_decodeBinary((UA_ByteString *)&__local->typeId);
      local_28 = local_28 | UVar1;
      break;
    default:
      local_28 = 0x80020000;
    }
    dst_local._4_4_ = local_28;
  }
  return dst_local._4_4_;
}

Assistant:

static UA_StatusCode
NodeId_decodeBinary(UA_NodeId *dst, const UA_DataType *_) {
    UA_Byte dstByte = 0, encodingByte = 0;
    UA_UInt16 dstUInt16 = 0;
    UA_StatusCode retval = Byte_decodeBinary(&encodingByte, NULL);
    if(retval != UA_STATUSCODE_GOOD)
        return retval;
    switch (encodingByte) {
    case UA_NODEIDTYPE_NUMERIC_TWOBYTE:
        dst->identifierType = UA_NODEIDTYPE_NUMERIC;
        retval = Byte_decodeBinary(&dstByte, NULL);
        dst->identifier.numeric = dstByte;
        dst->namespaceIndex = 0;
        break;
    case UA_NODEIDTYPE_NUMERIC_FOURBYTE:
        dst->identifierType = UA_NODEIDTYPE_NUMERIC;
        retval |= Byte_decodeBinary(&dstByte, NULL);
        dst->namespaceIndex = dstByte;
        retval |= UInt16_decodeBinary(&dstUInt16, NULL);
        dst->identifier.numeric = dstUInt16;
        break;
    case UA_NODEIDTYPE_NUMERIC_COMPLETE:
        dst->identifierType = UA_NODEIDTYPE_NUMERIC;
        retval |= UInt16_decodeBinary(&dst->namespaceIndex, NULL);
        retval |= UInt32_decodeBinary(&dst->identifier.numeric, NULL);
        break;
    case UA_NODEIDTYPE_STRING:
        dst->identifierType = UA_NODEIDTYPE_STRING;
        retval |= UInt16_decodeBinary(&dst->namespaceIndex, NULL);
        retval |= String_decodeBinary(&dst->identifier.string, NULL);
        break;
    case UA_NODEIDTYPE_GUID:
        dst->identifierType = UA_NODEIDTYPE_GUID;
        retval |= UInt16_decodeBinary(&dst->namespaceIndex, NULL);
        retval |= Guid_decodeBinary(&dst->identifier.guid, NULL);
        break;
    case UA_NODEIDTYPE_BYTESTRING:
        dst->identifierType = UA_NODEIDTYPE_BYTESTRING;
        retval |= UInt16_decodeBinary(&dst->namespaceIndex, NULL);
        retval |= ByteString_decodeBinary(&dst->identifier.byteString);
        break;
    default:
        retval |= UA_STATUSCODE_BADINTERNALERROR;
        break;
    }
    return retval;
}